

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_uvector_op(sexp ctx,sexp self,sexp_sint_t n,sexp elt_type,sexp len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sexp psVar4;
  sexp self_00;
  ulong in_RCX;
  long in_RDI;
  ulong in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_sint_t clen;
  sexp_sint_t elen;
  sexp_sint_t etype;
  sexp in_stack_ffffffffffffffa8;
  sexp i;
  sexp ctx_00;
  sexp in_stack_ffffffffffffffb8;
  sexp local_8;
  
  auVar2._8_8_ = (long)in_RCX >> 0x3f;
  auVar2._0_8_ = in_RCX & 0xfffffffffffffffe;
  psVar4 = SUB168(auVar2 / SEXT816(2),0);
  auVar3._8_8_ = (long)in_R8 >> 0x3f;
  auVar3._0_8_ = in_R8 & 0xfffffffffffffffe;
  self_00 = SUB168(auVar3 / SEXT816(2),0);
  ctx_00 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  if (psVar4 == (sexp)&DAT_00000003) {
    local_8 = sexp_make_bytes_op((sexp)&DAT_00000003,self_00,(sexp_sint_t)in_stack_ffffffffffffffb8,
                                 ctx_00,in_stack_ffffffffffffffa8);
  }
  else if ((in_RCX & 1) == 1) {
    if ((in_R8 & 1) == 1) {
      if (((long)psVar4 < 1) || (0xf < (long)psVar4)) {
        local_8 = sexp_xtype_exception
                            (self_00,in_stack_ffffffffffffffb8,(char *)ctx_00,
                             in_stack_ffffffffffffffa8);
      }
      else if ((long)self_00 < 0) {
        local_8 = sexp_xtype_exception
                            (self_00,in_stack_ffffffffffffffb8,(char *)ctx_00,
                             in_stack_ffffffffffffffa8);
      }
      else {
        i = *(sexp *)(in_RDI + 0x6080);
        *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa0;
        local_8 = sexp_alloc_tagged_aux(ctx_00,(size_t)i,(sexp_uint_t)&stack0xffffffffffffffb0);
        if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
          bVar1 = psVar4[0x38].value.flonum_bits[0x3a38];
          (local_8->value).flonum_bits[8] = (char)psVar4;
          (local_8->value).type.slots = self_00;
          psVar4 = sexp_make_bytes_op(psVar4,self_00,(long)((long)self_00 * (ulong)bVar1 + 7) / 8,
                                      local_8,i);
          (local_8->value).type.name = psVar4;
          if ((((local_8->value).stack.length & 3) == 0) &&
             (((local_8->value).type.name)->tag == 0x13)) {
            local_8 = (sexp)(local_8->value).flonum;
          }
        }
        *(sexp *)(in_RDI + 0x6080) = i;
      }
    }
    else {
      local_8 = sexp_type_exception(self_00,in_stack_ffffffffffffffb8,(sexp_uint_t)ctx_00,
                                    in_stack_ffffffffffffffa8);
    }
  }
  else {
    local_8 = sexp_type_exception(self_00,in_stack_ffffffffffffffb8,(sexp_uint_t)ctx_00,
                                  in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

sexp sexp_make_uvector_op(sexp ctx, sexp self, sexp_sint_t n, sexp elt_type, sexp len) {
  sexp_sint_t etype = sexp_unbox_fixnum(elt_type), elen = sexp_unbox_fixnum(len), clen;
  sexp_gc_var1(res);
  if (etype == SEXP_U8)
    return sexp_make_bytes(ctx, len, SEXP_ZERO);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, elt_type);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
  if (etype < SEXP_U1 || etype >= SEXP_END_OF_UNIFORM_TYPES)
    return sexp_xtype_exception(ctx, self, "unknown uniform vector type", elt_type);
  if (elen < 0)
    return sexp_xtype_exception(ctx, self, "negative length", len);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_type(ctx, uvector, SEXP_UNIFORM_VECTOR);
  if (!sexp_exceptionp(res)) {
    clen = ((elen * sexp_uvector_element_size(etype)) + 7) / 8;
    sexp_uvector_type(res) = etype;
    sexp_uvector_length(res) = elen;
    sexp_uvector_bytes(res) = sexp_make_bytes(ctx, sexp_make_fixnum(clen), SEXP_ZERO);
    if (sexp_exceptionp(sexp_uvector_bytes(res)))
      res = sexp_uvector_bytes(res);
  }
  sexp_gc_release1(ctx);
  return res;
}